

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

Vector3D *
CGL::Collada::spectrum_from_string(Vector3D *__return_storage_ptr__,string *Vector3D_string)

{
  stringstream ss;
  
  (__return_storage_ptr__->field_0).field_0.x = 0.0;
  (__return_storage_ptr__->field_0).field_0.y = 0.0;
  (__return_storage_ptr__->field_0).field_0.z = 0.0;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&ss,(string *)Vector3D_string,_S_out|_S_in);
  std::istream::_M_extract<double>((double *)&ss);
  std::istream::_M_extract<double>((double *)&ss);
  std::istream::_M_extract<double>((double *)&ss);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3D spectrum_from_string ( string Vector3D_string ) {

  Vector3D s;

  stringstream ss (Vector3D_string);
  ss >> s.r;
  ss >> s.g;
  ss >> s.b;

  return s;

}